

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

void __thiscall f8n::db::Connection::Initialize(Connection *this,uint cache)

{
  string cacheSize;
  string local_38;
  
  sqlite3_enable_shared_cache(1);
  sqlite3_busy_timeout(this->connection,10000);
  sqlite3_exec(this->connection,"PRAGMA optimize",(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
  sqlite3_exec(this->connection,"PRAGMA synchronous=NORMAL",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  sqlite3_exec(this->connection,"PRAGMA page_size=4096",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  sqlite3_exec(this->connection,"PRAGMA auto_vacuum=0",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  sqlite3_exec(this->connection,"PRAGMA journal_mode=WAL",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  if (cache != 0) {
    std::__cxx11::to_string(&local_38,cache >> 2);
    std::operator+(&cacheSize,"PRAGMA cache_size=",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    sqlite3_exec(this->connection,cacheSize._M_dataplus._M_p,(sqlite3_callback)0x0,(void *)0x0,
                 (char **)0x0);
    std::__cxx11::string::~string((string *)&cacheSize);
  }
  sqlite3_exec(this->connection,"PRAGMA case_sensitive_like=0",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  sqlite3_exec(this->connection,"PRAGMA count_changes=0",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  sqlite3_exec(this->connection,"PRAGMA legacy_file_format=OFF",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  sqlite3_exec(this->connection,"PRAGMA temp_store=MEMORY",(sqlite3_callback)0x0,(void *)0x0,
               (char **)0x0);
  return;
}

Assistant:

void Connection::Initialize(unsigned int cache) {
    sqlite3_enable_shared_cache(1);
    sqlite3_busy_timeout(this->connection, 10000);

    sqlite3_exec(this->connection, "PRAGMA optimize", nullptr, nullptr, nullptr);           // Optimize the database when applicable
    sqlite3_exec(this->connection, "PRAGMA synchronous=NORMAL", nullptr, nullptr, nullptr); // NORMAL useful for auto-checkpointing with WAL
    sqlite3_exec(this->connection, "PRAGMA page_size=4096", nullptr, nullptr, nullptr);	    // According to windows standard page size
    sqlite3_exec(this->connection, "PRAGMA auto_vacuum=0", nullptr, nullptr, nullptr);	    // No autovaccum.
    sqlite3_exec(this->connection, "PRAGMA journal_mode=WAL", nullptr, nullptr, nullptr);   // Allow reading while writing (write-ahead-logging)

    if (cache != 0) {
        // Divide by 4 to since the page_size is 4096
        // Total cache is the same as page_size*cache_size
        cache = cache / 4;
        std::string cacheSize("PRAGMA cache_size=" + std::to_string(cache));
        sqlite3_exec(this->connection,cacheSize.c_str(), nullptr, nullptr, nullptr); // size * 1.5kb = 6Mb cache
    }

    sqlite3_exec(this->connection, "PRAGMA case_sensitive_like=0", nullptr, nullptr, nullptr);   // More speed if case insensitive
    sqlite3_exec(this->connection, "PRAGMA count_changes=0", nullptr, nullptr, nullptr);         // If set it counts changes on SQL UPDATE. More speed when not.
    sqlite3_exec(this->connection, "PRAGMA legacy_file_format=OFF", nullptr, nullptr, nullptr);  // No reason to be backwards compatible :)
    sqlite3_exec(this->connection, "PRAGMA temp_store=MEMORY", nullptr, nullptr, nullptr);       // MEMORY, not file. More speed.
}